

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sem_impl_fifo.c
# Opt level: O3

fifo_sem_t * fifo_sem_open(char *name,int oflag,...)

{
  __mode_t __mode;
  char in_AL;
  uint __fd;
  uint __fd_00;
  uint uVar1;
  int iVar2;
  fifo_sem_t *__ptr;
  ssize_t sVar3;
  int *piVar4;
  ulong in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong unaff_R13;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char c;
  va_list ap;
  undefined1 local_10d;
  uint local_10c;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  ulong local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((oflag & 0x40U) != 0) {
    local_f8 = local_e8;
    local_100 = &stack0x00000008;
    local_d8._0_4_ = (__mode_t)in_RDX;
    local_108 = 0x3000000020;
    unaff_R13 = in_RCX & 0xffffffff;
    __mode = (__mode_t)local_d8;
    iVar2 = mkfifo(name,__mode);
    if (iVar2 < 0) {
      piVar4 = __errno_location();
      if ((char)oflag < '\0') {
        return (fifo_sem_t *)0xffffffffffffffff;
      }
      oflag = 0;
      if (*piVar4 != 0x11) {
        return (fifo_sem_t *)0xffffffffffffffff;
      }
    }
  }
  __ptr = (fifo_sem_t *)malloc(0xc);
  if (__ptr != (fifo_sem_t *)0x0) {
    local_10c = oflag;
    __fd = open(name,0x800);
    __ptr->sem_fd[0] = __fd;
    __fd_00 = open(name,0x801);
    __ptr->sem_fd[1] = __fd_00;
    if (((-1 < (int)(__fd_00 | __fd)) && (uVar1 = fcntl(__fd,3), -1 < (int)uVar1)) &&
       (iVar2 = fcntl(__fd,4,(ulong)(uVar1 & 0x7ffff7ff)), -1 < iVar2)) {
      if (((local_10c & 0x40) != 0) && ((int)unaff_R13 != 0)) {
        do {
          sVar3 = write(__fd_00,&local_10d,1);
          if (sVar3 != 1) goto LAB_0010135d;
          uVar1 = (int)unaff_R13 - 1;
          unaff_R13 = (ulong)uVar1;
        } while (uVar1 != 0);
      }
      __ptr->sem_magic = -0x7698badd;
      return __ptr;
    }
LAB_0010135d:
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    if ((local_10c & 0x40) != 0) {
      unlink(name);
    }
    close(__fd);
    close(__fd_00);
    free(__ptr);
    *piVar4 = iVar2;
  }
  return (fifo_sem_t *)0xffffffffffffffff;
}

Assistant:

fifo_sem_t *fifo_sem_open(const char* name, int oflag, ...) {
  fifo_sem_t *sem;
  va_list ap;
  mode_t mode;
  unsigned int value;
  char c;
  int i, save_errno,flags;

  if (oflag & O_CREAT) {
    va_start(ap, oflag);
    mode = va_arg(ap, mode_t);
    value = va_arg(ap, unsigned int);
    va_end(ap);
    if (mkfifo(name, mode) < 0) {
      if (errno == EEXIST && (oflag & O_EXCL) == 0) {
        oflag &= ~O_CREAT;
      } else {
        return FIFO_SEM_FAILED;
      }
    }
  }

  sem = (fifo_sem_t*)malloc(sizeof(fifo_sem_t));
  if (sem == NULL) {
    return FIFO_SEM_FAILED;
  }

  //NONBLOCK to avoid blocking here
  sem->sem_fd[0] = open(name, O_RDONLY | O_NONBLOCK);
  sem->sem_fd[1] = open(name, O_WRONLY | O_NONBLOCK);

  if (sem->sem_fd[0] < 0 || sem->sem_fd[1] < 0) {
    goto fifo_sem_open_error;
  }

  // reset NONBLOCK flag
  flags = fcntl(sem->sem_fd[0], F_GETFL);
  if (flags < 0) {
    goto fifo_sem_open_error;
  }

  flags &= ~O_NONBLOCK;

  if (fcntl(sem->sem_fd[0], F_SETFL, flags) < 0) {
    goto fifo_sem_open_error;
  }

  if (oflag & O_CREAT) {
    for (i = 0; i < value; ++i) {
      if (write(sem->sem_fd[1], &c, 1) != 1) {
        goto fifo_sem_open_error;
      }
    }
  }

  sem->sem_magic = FIFO_SEM_MAGIC;
  return sem;

fifo_sem_open_error:
  save_errno = errno;
  if (oflag & O_CREAT) {
    unlink(name);
  }
  close(sem->sem_fd[0]);
  close(sem->sem_fd[1]);
  free(sem);
  errno = save_errno;
  return FIFO_SEM_FAILED;
}